

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::DrawXFBStreamInstanced::check(DrawXFBStreamInstanced *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar4;
  uint local_58;
  GLuint i;
  allocator<float> local_41;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> pixels;
  GLuint number_of_pixels;
  Functions *gl;
  DrawXFBStreamInstanced *this_local;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x10;
  std::allocator<float>::allocator(&local_41);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40,0x10,&local_41);
  std::allocator<float>::~allocator(&local_41);
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1220);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,0);
  (*pcVar1)(0,0,4,4,0x1903,0x1406,pvVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1944);
  local_58 = 0;
  do {
    if (pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ <= local_58) {
      this_local._7_1_ = true;
LAB_00e3870a:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_40);
      return this_local._7_1_;
    }
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,(ulong)local_58);
    if (0.0625 < ABS(*pvVar4 - 1.0)) {
      this_local._7_1_ = false;
      goto LAB_00e3870a;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFBStreamInstanced::check()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(number_of_pixels);

	gl.readPixels(0, 0, s_view_size, s_view_size, GL_RED, GL_FLOAT, &pixels[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if (fabs(pixels[i] - 1.f) > 0.0625 /* precision, expected result == 1.0 */)
		{
			return false;
		}
	}

	return true;
}